

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O0

FT_Error cff_size_request(FT_Size size,FT_Size_Request req)

{
  long lVar1;
  undefined8 *puVar2;
  long b_;
  long c_;
  int iVar3;
  FT_Error FVar4;
  FT_Long local_90;
  FT_Pos y_scale;
  FT_Pos x_scale;
  FT_Long sub_upm;
  CFF_SubFont sub;
  FT_UInt i;
  FT_Long top_upm;
  CFF_Internal internal;
  CFF_Font_conflict font;
  CFF_Face cffface_1;
  FT_ULong strike_index;
  SFNT_Service sfnt;
  CFF_Face cffface;
  PSH_Globals_Funcs funcs;
  CFF_Size cffsize;
  FT_Size_Request req_local;
  FT_Size size_local;
  
  funcs = (PSH_Globals_Funcs)size;
  cffsize = (CFF_Size)req;
  req_local = (FT_Size_Request)size;
  if ((size->face->face_flags & 2U) != 0) {
    sfnt = (SFNT_Service)size->face;
    strike_index = (FT_ULong)sfnt[3].load_bhed;
    iVar3 = (**(code **)(strike_index + 0xd0))(sfnt,req,&cffface_1);
    if (iVar3 == 0) {
      FVar4 = cff_size_select((FT_Size)req_local,(FT_ULong)cffface_1);
      return FVar4;
    }
    funcs[3].destroy = (PSH_Globals_DestroyFunc)0xffffffff;
  }
  FT_Request_Metrics(*(FT_Face *)req_local,(FT_Size_Request)cffsize);
  cffface = (CFF_Face)cff_size_get_globals_funcs((CFF_Size)funcs);
  if (cffface != (CFF_Face)0x0) {
    lVar1 = *(long *)(*(long *)req_local + 0x450);
    puVar2 = *(undefined8 **)req_local[2].height;
    b_ = *(long *)(lVar1 + 0x6d0);
    (*(PSH_Globals_SetScaleFunc)(cffface->root).face_index)
              ((PSH_Globals)*puVar2,*(FT_Fixed *)(req_local + 1),req_local[1].width,0,0);
    for (sub._4_4_ = *(int *)(lVar1 + 0xb30); sub._4_4_ != 0; sub._4_4_ = sub._4_4_ + -1) {
      c_ = *(long *)(*(long *)(lVar1 + 0xb38 + (ulong)(sub._4_4_ - 1) * 8) + 0x68);
      if (b_ == c_) {
        y_scale = *(FT_Pos *)(req_local + 1);
        local_90 = req_local[1].width;
      }
      else {
        y_scale = FT_MulDiv(*(FT_Long *)(req_local + 1),b_,c_);
        local_90 = FT_MulDiv(req_local[1].width,b_,c_);
      }
      (*(code *)(cffface->root).face_index)(puVar2[(ulong)(sub._4_4_ - 1) + 1],y_scale,local_90,0);
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_size_request( FT_Size          size,
                    FT_Size_Request  req )
  {
    CFF_Size           cffsize = (CFF_Size)size;
    PSH_Globals_Funcs  funcs;


#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

    if ( FT_HAS_FIXED_SIZES( size->face ) )
    {
      CFF_Face      cffface = (CFF_Face)size->face;
      SFNT_Service  sfnt    = (SFNT_Service)cffface->sfnt;
      FT_ULong      strike_index;


      if ( sfnt->set_sbit_strike( cffface, req, &strike_index ) )
        cffsize->strike_index = 0xFFFFFFFFUL;
      else
        return cff_size_select( size, strike_index );
    }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

    FT_Request_Metrics( size->face, req );

    funcs = cff_size_get_globals_funcs( cffsize );

    if ( funcs )
    {
      CFF_Face      cffface  = (CFF_Face)size->face;
      CFF_Font      font     = (CFF_Font)cffface->extra.data;
      CFF_Internal  internal = (CFF_Internal)size->internal->module_data;

      FT_Long  top_upm  = (FT_Long)font->top_font.font_dict.units_per_em;
      FT_UInt  i;


      funcs->set_scale( internal->topfont,
                        size->metrics.x_scale, size->metrics.y_scale,
                        0, 0 );

      for ( i = font->num_subfonts; i > 0; i-- )
      {
        CFF_SubFont  sub     = font->subfonts[i - 1];
        FT_Long      sub_upm = (FT_Long)sub->font_dict.units_per_em;
        FT_Pos       x_scale, y_scale;


        if ( top_upm != sub_upm )
        {
          x_scale = FT_MulDiv( size->metrics.x_scale, top_upm, sub_upm );
          y_scale = FT_MulDiv( size->metrics.y_scale, top_upm, sub_upm );
        }
        else
        {
          x_scale = size->metrics.x_scale;
          y_scale = size->metrics.y_scale;
        }

        funcs->set_scale( internal->subfonts[i - 1],
                          x_scale, y_scale, 0, 0 );
      }
    }

    return FT_Err_Ok;
  }